

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtooltip.cpp
# Opt level: O1

void __thiscall QTipLabel::reuseTip(QTipLabel *this,QString *text,int msecDisplayTime,QPoint *pos)

{
  long in_FS_OFFSET;
  code *local_50;
  undefined8 local_48;
  code *local_40;
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->styleSheetParent != (QWidget *)0x0) {
    local_40 = QObject::destroyed;
    local_38 = 0;
    local_50 = styleSheetParentDestroyed;
    local_48 = 0;
    QObject::disconnectImpl
              (&this->styleSheetParent->super_QObject,&local_40,(QObject *)this,&local_50,
               (QMetaObject *)&QObject::staticMetaObject);
    this->styleSheetParent = (QWidget *)0x0;
  }
  QLabel::setText(&this->super_QLabel,text);
  updateSize(this,pos);
  restartExpireTimer(this,msecDisplayTime);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTipLabel::reuseTip(const QString &text, int msecDisplayTime, const QPoint &pos)
{
#ifndef QT_NO_STYLE_STYLESHEET
    if (styleSheetParent){
        disconnect(styleSheetParent, &QWidget::destroyed,
                   this, &QTipLabel::styleSheetParentDestroyed);
        styleSheetParent = nullptr;
    }
#endif

    setText(text);
    updateSize(pos);
    restartExpireTimer(msecDisplayTime);
}